

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

ScalarFunction * duckdb::AddFunction::GetFunction(LogicalType *left_type,LogicalType *right_type)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  initializer_list<duckdb::LogicalType> iVar3;
  initializer_list<duckdb::LogicalType> iVar4;
  initializer_list<duckdb::LogicalType> iVar5;
  initializer_list<duckdb::LogicalType> iVar6;
  initializer_list<duckdb::LogicalType> iVar7;
  initializer_list<duckdb::LogicalType> iVar8;
  initializer_list<duckdb::LogicalType> iVar9;
  initializer_list<duckdb::LogicalType> iVar10;
  initializer_list<duckdb::LogicalType> iVar11;
  initializer_list<duckdb::LogicalType> iVar12;
  initializer_list<duckdb::LogicalType> iVar13;
  initializer_list<duckdb::LogicalType> iVar14;
  initializer_list<duckdb::LogicalType> iVar15;
  initializer_list<duckdb::LogicalType> iVar16;
  initializer_list<duckdb::LogicalType> iVar17;
  initializer_list<duckdb::LogicalType> iVar18;
  bool bVar19;
  LogicalTypeId LVar20;
  LogicalTypeId LVar21;
  LogicalTypeId LVar22;
  undefined8 uVar23;
  LogicalType *in_RDX;
  LogicalType *in_RSI;
  ScalarFunction *in_RDI;
  ScalarFunction *function;
  LogicalType *in_stack_ffffffffffffdc88;
  BaseScalarFunction *pBVar24;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_ffffffffffffdc90;
  BaseScalarFunction *pBVar25;
  code *this;
  iterator in_stack_ffffffffffffdc98;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_ffffffffffffdca0;
  LogicalTypeId in_stack_ffffffffffffdcaf;
  undefined4 in_stack_ffffffffffffdcb0;
  undefined4 in_stack_ffffffffffffdcb4;
  undefined8 in_stack_ffffffffffffdcb8;
  undefined8 in_stack_ffffffffffffdcd8;
  PhysicalType type;
  allocator *paVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdd18;
  undefined8 ****ppppuVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdd20;
  string *in_stack_ffffffffffffdd28;
  NotImplementedException *in_stack_ffffffffffffdd30;
  undefined8 in_stack_ffffffffffffdd58;
  PhysicalType type_00;
  undefined1 **ppuVar28;
  bind_scalar_function_t in_stack_ffffffffffffdd68;
  scalar_function_t *in_stack_ffffffffffffdd70;
  scalar_function_t *function_00;
  LogicalType *in_stack_ffffffffffffdd78;
  LogicalType *return_type;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffdd80;
  string *in_stack_ffffffffffffdd88;
  ScalarFunction *in_stack_ffffffffffffdd90;
  bind_scalar_function_extended_t in_stack_ffffffffffffdda0;
  function_statistics_t in_stack_ffffffffffffdda8;
  undefined8 ****ppppuVar29;
  init_local_state_t in_stack_ffffffffffffddb0;
  LogicalType *in_stack_ffffffffffffddb8;
  FunctionStability in_stack_ffffffffffffddc0;
  FunctionStability side_effects;
  FunctionNullHandling in_stack_ffffffffffffddc8;
  FunctionNullHandling null_handling;
  bind_lambda_function_t in_stack_ffffffffffffddd0;
  undefined8 ****local_21f8;
  undefined8 ****local_21a8;
  undefined8 ****local_2158;
  undefined8 ****local_2108;
  undefined8 ****local_20b8;
  undefined8 ****local_2068;
  undefined8 ****local_2018;
  undefined8 ****local_1fc8;
  undefined8 ****local_1f78;
  undefined8 ****local_1f28;
  undefined8 ****local_1ed8;
  undefined8 ****local_1e88;
  undefined8 ****local_1e30;
  undefined8 ****local_1dd8;
  undefined8 ****local_1d80;
  allocator local_1cf9;
  string local_1cf8 [296];
  undefined1 ****local_1bd0;
  undefined8 ***local_1bc8 [3];
  undefined1 local_1bb0 [24];
  undefined1 ****local_1b98;
  undefined8 local_1b90;
  allocator local_1b69;
  string local_1b68 [39];
  undefined1 local_1b41;
  undefined1 local_1a39 [33];
  undefined1 local_1a18 [24];
  undefined1 *local_1a00;
  undefined8 local_19f8;
  LogicalType local_19d1;
  undefined1 local_19a9;
  undefined1 local_18a1;
  undefined1 ****local_18a0;
  undefined8 ***local_1898 [3];
  undefined1 local_1880 [24];
  undefined1 ****local_1868;
  undefined8 local_1860;
  allocator local_1839;
  string local_1838 [39];
  undefined1 local_1811;
  undefined1 ****local_1708;
  undefined8 ***local_1700 [3];
  undefined1 local_16e8 [24];
  undefined1 ****local_16d0;
  undefined8 local_16c8;
  allocator local_16a1;
  string local_16a0 [39];
  undefined1 local_1679;
  undefined1 ****local_1570;
  undefined8 ***local_1568 [3];
  undefined1 local_1550 [24];
  undefined1 ****local_1538;
  undefined8 local_1530;
  allocator local_1509;
  string local_1508 [39];
  undefined1 local_14e1;
  undefined1 ****local_13d8;
  undefined8 ***local_13d0 [3];
  undefined1 local_13b8 [24];
  undefined1 ****local_13a0;
  undefined8 local_1398;
  allocator local_1371;
  string local_1370 [39];
  undefined1 local_1349;
  undefined1 ****local_1240;
  undefined8 ***local_1238 [3];
  undefined1 local_1220 [24];
  undefined1 ****local_1208;
  undefined8 local_1200;
  allocator local_11d9;
  string local_11d8 [39];
  undefined1 local_11b1;
  undefined1 ****local_10a8;
  undefined8 ***local_10a0 [3];
  undefined1 local_1088 [24];
  undefined1 ****local_1070;
  undefined8 local_1068;
  allocator local_1041;
  string local_1040 [39];
  undefined1 local_1019;
  undefined1 ****local_f10;
  undefined8 ***local_f08 [3];
  undefined1 local_ef0 [24];
  undefined1 ****local_ed8;
  undefined8 local_ed0;
  allocator local_ea9;
  string local_ea8 [39];
  undefined1 local_e81;
  undefined1 ****local_d78;
  undefined8 ***local_d70 [3];
  undefined1 local_d58 [24];
  undefined1 ****local_d40;
  undefined8 local_d38;
  allocator local_d11;
  string local_d10 [39];
  undefined1 local_ce9;
  undefined1 ****local_be0;
  undefined8 ***local_bd8 [3];
  undefined1 local_bc0 [24];
  undefined1 ****local_ba8;
  undefined8 local_ba0;
  allocator local_b79;
  string local_b78 [39];
  undefined1 local_b51;
  undefined1 ****local_a48;
  undefined8 ***local_a40 [3];
  undefined1 local_a28 [24];
  undefined1 ****local_a10;
  undefined8 local_a08;
  allocator local_9e1;
  string local_9e0 [39];
  undefined1 local_9b9;
  undefined1 ****local_8b0;
  undefined8 ***local_8a8 [3];
  undefined1 local_890 [24];
  undefined1 ****local_878;
  undefined8 local_870;
  allocator local_849;
  string local_848 [39];
  undefined1 local_821;
  undefined1 ****local_718;
  undefined8 ***local_710 [3];
  undefined1 local_6f8 [24];
  undefined1 ****local_6e0;
  undefined8 local_6d8;
  allocator local_6b1;
  string local_6b0 [39];
  undefined1 local_689;
  undefined1 ****local_580;
  undefined8 ***local_578 [3];
  undefined1 local_560 [24];
  undefined1 ****local_548;
  undefined8 local_540;
  allocator local_519;
  string local_518 [39];
  undefined1 local_4f1;
  undefined1 ****local_3e8;
  undefined8 ***local_3e0 [3];
  undefined1 local_3c8 [24];
  undefined1 ****local_3b0;
  undefined8 local_3a8;
  allocator local_381;
  string local_380 [39];
  undefined1 local_359;
  undefined1 ****local_250;
  undefined8 ***local_248 [3];
  undefined1 local_230 [24];
  undefined1 ****local_218;
  undefined8 local_210;
  allocator local_1e9;
  string local_1e8 [39];
  undefined1 local_1c1;
  undefined1 ****local_b8;
  undefined8 ***local_b0 [3];
  undefined1 local_98 [24];
  undefined1 ****local_80;
  undefined8 local_78;
  allocator local_41;
  string local_40 [39];
  undefined1 local_19;
  LogicalType *local_18;
  LogicalType *local_10;
  
  LVar21 = (LogicalTypeId)((ulong)in_stack_ffffffffffffdcb8 >> 0x38);
  type = (PhysicalType)((ulong)in_stack_ffffffffffffdcd8 >> 0x38);
  type_00 = (PhysicalType)((ulong)in_stack_ffffffffffffdd58 >> 0x38);
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar19 = LogicalType::IsNumeric((LogicalType *)0x1246a6f);
  if (bVar19) {
    LVar22 = LogicalType::id(local_10);
    LVar20 = LogicalType::id(local_18);
    if (LVar22 == LVar20) {
      LVar21 = LogicalType::id(local_10);
      if (LVar21 == DECIMAL) {
        local_19 = 0;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_40,"+",&local_41);
        local_b8 = (undefined1 ****)local_b0;
        LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88)
        ;
        local_b8 = (undefined1 ****)local_98;
        LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88)
        ;
        local_80 = (undefined1 ****)local_b0;
        local_78 = 2;
        ::std::allocator<duckdb::LogicalType>::allocator
                  ((allocator<duckdb::LogicalType> *)0x1246b69);
        iVar1._M_len = (size_type)in_stack_ffffffffffffdca0;
        iVar1._M_array = in_stack_ffffffffffffdc98;
        vector<duckdb::LogicalType,_true>::vector
                  ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar1,
                   (allocator_type *)in_stack_ffffffffffffdc88);
        LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88)
        ;
        ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        function(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
        LogicalType::LogicalType
                  ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                   in_stack_ffffffffffffdcaf);
        pBVar25 = (BaseScalarFunction *)0x0;
        pBVar24 = (BaseScalarFunction *)0x0;
        ScalarFunction::ScalarFunction
                  (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                   in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                   in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,
                   in_stack_ffffffffffffddb8,in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,
                   in_stack_ffffffffffffddd0);
        LogicalType::~LogicalType((LogicalType *)0x1246c54);
        ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                   *)0x1246c61);
        LogicalType::~LogicalType((LogicalType *)0x1246c6e);
        vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1246c7b);
        ::std::allocator<duckdb::LogicalType>::~allocator
                  ((allocator<duckdb::LogicalType> *)0x1246c88);
        local_1d80 = &local_80;
        do {
          local_1d80 = local_1d80 + -3;
          LogicalType::~LogicalType((LogicalType *)0x1246cbd);
        } while (local_1d80 != local_b0);
        ::std::__cxx11::string::~string(local_40);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
        BaseScalarFunction::SetReturnsError(pBVar24);
        BaseScalarFunction::~BaseScalarFunction(pBVar25);
        in_RDI->serialize = SerializeDecimalArithmetic;
        in_RDI->deserialize =
             DeserializeDecimalArithmetic<duckdb::AddOperator,duckdb::DecimalAddOverflowCheck,false>
        ;
        return in_RDI;
      }
      bVar19 = LogicalType::IsIntegral(local_10);
      if (!bVar19) {
        local_359 = 0;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_380,"+",&local_381);
        local_3e8 = (undefined1 ****)local_3e0;
        LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88)
        ;
        local_3e8 = (undefined1 ****)local_3c8;
        LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88)
        ;
        local_3b0 = (undefined1 ****)local_3e0;
        local_3a8 = 2;
        ::std::allocator<duckdb::LogicalType>::allocator
                  ((allocator<duckdb::LogicalType> *)0x1247445);
        iVar3._M_len = (size_type)in_stack_ffffffffffffdca0;
        iVar3._M_array = in_stack_ffffffffffffdc98;
        vector<duckdb::LogicalType,_true>::vector
                  ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar3,
                   (allocator_type *)in_stack_ffffffffffffdc88);
        LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88)
        ;
        LogicalType::InternalType(local_10);
        GetScalarBinaryFunction<duckdb::AddOperator>(type);
        LogicalType::LogicalType
                  ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                   in_stack_ffffffffffffdcaf);
        pBVar25 = (BaseScalarFunction *)0x0;
        pBVar24 = (BaseScalarFunction *)0x0;
        ScalarFunction::ScalarFunction
                  (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                   in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                   in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,
                   in_stack_ffffffffffffddb8,in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,
                   in_stack_ffffffffffffddd0);
        LogicalType::~LogicalType((LogicalType *)0x1247540);
        ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                   *)0x124754d);
        LogicalType::~LogicalType((LogicalType *)0x124755a);
        vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1247567);
        ::std::allocator<duckdb::LogicalType>::~allocator
                  ((allocator<duckdb::LogicalType> *)0x1247574);
        local_1e30 = &local_3b0;
        do {
          local_1e30 = local_1e30 + -3;
          LogicalType::~LogicalType((LogicalType *)0x12475a9);
        } while (local_1e30 != local_3e0);
        ::std::__cxx11::string::~string(local_380);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_381);
        BaseScalarFunction::SetReturnsError(pBVar24);
        BaseScalarFunction::~BaseScalarFunction(pBVar25);
        return in_RDI;
      }
      local_1c1 = 0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1e8,"+",&local_1e9);
      local_250 = (undefined1 ****)local_248;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_250 = (undefined1 ****)local_230;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_218 = (undefined1 ****)local_248;
      local_210 = 2;
      ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x1246fde);
      iVar2._M_len = (size_type)in_stack_ffffffffffffdca0;
      iVar2._M_array = in_stack_ffffffffffffdc98;
      vector<duckdb::LogicalType,_true>::vector
                ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar2,
                 (allocator_type *)in_stack_ffffffffffffdc88);
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      LogicalType::InternalType(local_10);
      GetScalarIntegerFunction<duckdb::AddOperatorOverflowCheck>(type_00);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      this = 
      PropagateNumericStats<duckdb::TryAddOperator,duckdb::AddPropagateStatistics,duckdb::AddOperator>
      ;
      pBVar24 = (BaseScalarFunction *)0x0;
      ScalarFunction::ScalarFunction
                (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                 in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                 in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,
                 in_stack_ffffffffffffddb8,in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,
                 in_stack_ffffffffffffddd0);
      LogicalType::~LogicalType((LogicalType *)0x12470dc);
      ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *
                )0x12470e9);
      LogicalType::~LogicalType((LogicalType *)0x12470f6);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1247103);
      ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x1247110)
      ;
      local_1dd8 = &local_218;
      do {
        local_1dd8 = local_1dd8 + -3;
        LogicalType::~LogicalType((LogicalType *)0x1247145);
      } while (local_1dd8 != local_248);
      ::std::__cxx11::string::~string(local_1e8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      BaseScalarFunction::SetReturnsError(pBVar24);
      BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)this);
      return in_RDI;
    }
  }
  LVar22 = LogicalType::id(local_10);
  switch(LVar22) {
  case INTEGER:
    LVar22 = LogicalType::id(local_18);
    if (LVar22 == DATE) {
      local_b51 = 0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b78,"+",&local_b79);
      local_be0 = (undefined1 ****)local_bd8;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_be0 = (undefined1 ****)local_bc0;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_ba8 = (undefined1 ****)local_bd8;
      local_ba0 = 2;
      ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x1248a0b);
      iVar8._M_len = (size_type)in_stack_ffffffffffffdca0;
      iVar8._M_array = in_stack_ffffffffffffdc98;
      vector<duckdb::LogicalType,_true>::vector
                ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar8,
                 (allocator_type *)in_stack_ffffffffffffdc88);
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
      function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
                (in_stack_ffffffffffffdca0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 in_stack_ffffffffffffdc98);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      pBVar25 = (BaseScalarFunction *)0x0;
      pBVar24 = (BaseScalarFunction *)0x0;
      ScalarFunction::ScalarFunction
                (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                 in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                 in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,
                 in_stack_ffffffffffffddb8,in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,
                 in_stack_ffffffffffffddd0);
      LogicalType::~LogicalType((LogicalType *)0x1248aeb);
      ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *
                )0x1248af8);
      LogicalType::~LogicalType((LogicalType *)0x1248b05);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1248b12);
      ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x1248b1f)
      ;
      local_1fc8 = &local_ba8;
      do {
        local_1fc8 = local_1fc8 + -3;
        LogicalType::~LogicalType((LogicalType *)0x1248b54);
      } while (local_1fc8 != local_bd8);
      ::std::__cxx11::string::~string(local_b78);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_b79);
      BaseScalarFunction::SetReturnsError(pBVar24);
      BaseScalarFunction::~BaseScalarFunction(pBVar25);
      return in_RDI;
    }
    goto LAB_0124b825;
  default:
    goto LAB_0124b825;
  case DATE:
    LVar22 = LogicalType::id(local_18);
    if (LVar22 == INTEGER) {
      local_4f1 = 0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_518,"+",&local_519);
      local_580 = (undefined1 ****)local_578;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_580 = (undefined1 ****)local_560;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_548 = (undefined1 ****)local_578;
      local_540 = 2;
      ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x12478f8);
      iVar4._M_len = (size_type)in_stack_ffffffffffffdca0;
      iVar4._M_array = in_stack_ffffffffffffdc98;
      vector<duckdb::LogicalType,_true>::vector
                ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar4,
                 (allocator_type *)in_stack_ffffffffffffdc88);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
      function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
                (in_stack_ffffffffffffdca0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 in_stack_ffffffffffffdc98);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      pBVar25 = (BaseScalarFunction *)0x0;
      pBVar24 = (BaseScalarFunction *)0x0;
      ScalarFunction::ScalarFunction
                (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                 in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                 in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,
                 in_stack_ffffffffffffddb8,in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,
                 in_stack_ffffffffffffddd0);
      LogicalType::~LogicalType((LogicalType *)0x12479d5);
      ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *
                )0x12479e2);
      LogicalType::~LogicalType((LogicalType *)0x12479ef);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x12479fc);
      ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x1247a09)
      ;
      local_1e88 = &local_548;
      do {
        local_1e88 = local_1e88 + -3;
        LogicalType::~LogicalType((LogicalType *)0x1247a3e);
      } while (local_1e88 != local_578);
      ::std::__cxx11::string::~string(local_518);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_519);
      BaseScalarFunction::SetReturnsError(pBVar24);
      BaseScalarFunction::~BaseScalarFunction(pBVar25);
    }
    else {
      LVar22 = LogicalType::id(local_18);
      if (LVar22 == INTERVAL) {
        local_689 = 0;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_6b0,"+",&local_6b1);
        local_718 = (undefined1 ****)local_710;
        LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88)
        ;
        local_718 = (undefined1 ****)local_6f8;
        LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88)
        ;
        local_6e0 = (undefined1 ****)local_710;
        local_6d8 = 2;
        ::std::allocator<duckdb::LogicalType>::allocator
                  ((allocator<duckdb::LogicalType> *)0x1247d3a);
        iVar5._M_len = (size_type)in_stack_ffffffffffffdca0;
        iVar5._M_array = in_stack_ffffffffffffdc98;
        vector<duckdb::LogicalType,_true>::vector
                  ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar5,
                   (allocator_type *)in_stack_ffffffffffffdc88);
        LogicalType::LogicalType
                  ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                   in_stack_ffffffffffffdcaf);
        ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
        function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
                  (in_stack_ffffffffffffdca0,
                   (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                   in_stack_ffffffffffffdc98);
        LogicalType::LogicalType
                  ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                   in_stack_ffffffffffffdcaf);
        pBVar25 = (BaseScalarFunction *)0x0;
        pBVar24 = (BaseScalarFunction *)0x0;
        ScalarFunction::ScalarFunction
                  (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                   in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                   in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,
                   in_stack_ffffffffffffddb8,in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,
                   in_stack_ffffffffffffddd0);
        LogicalType::~LogicalType((LogicalType *)0x1247e17);
        ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                   *)0x1247e24);
        LogicalType::~LogicalType((LogicalType *)0x1247e31);
        vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1247e3e);
        ::std::allocator<duckdb::LogicalType>::~allocator
                  ((allocator<duckdb::LogicalType> *)0x1247e4b);
        local_1ed8 = &local_6e0;
        do {
          local_1ed8 = local_1ed8 + -3;
          LogicalType::~LogicalType((LogicalType *)0x1247e80);
        } while (local_1ed8 != local_710);
        ::std::__cxx11::string::~string(local_6b0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
        BaseScalarFunction::SetReturnsError(pBVar24);
        BaseScalarFunction::~BaseScalarFunction(pBVar25);
      }
      else {
        LVar22 = LogicalType::id(local_18);
        if (LVar22 == TIME) {
          local_821 = 0;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_848,"+",&local_849);
          local_8b0 = (undefined1 ****)local_8a8;
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
          local_8b0 = (undefined1 ****)local_890;
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
          local_878 = (undefined1 ****)local_8a8;
          local_870 = 2;
          ::std::allocator<duckdb::LogicalType>::allocator
                    ((allocator<duckdb::LogicalType> *)0x124817c);
          iVar6._M_len = (size_type)in_stack_ffffffffffffdca0;
          iVar6._M_array = in_stack_ffffffffffffdc98;
          vector<duckdb::LogicalType,_true>::vector
                    ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar6,
                     (allocator_type *)in_stack_ffffffffffffdc88);
          LogicalType::LogicalType
                    ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                     in_stack_ffffffffffffdcaf);
          ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
                    (in_stack_ffffffffffffdca0,
                     (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                     in_stack_ffffffffffffdc98);
          LogicalType::LogicalType
                    ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                     in_stack_ffffffffffffdcaf);
          pBVar25 = (BaseScalarFunction *)0x0;
          pBVar24 = (BaseScalarFunction *)0x0;
          ScalarFunction::ScalarFunction
                    (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                     in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                     in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,
                     in_stack_ffffffffffffddb8,in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,
                     in_stack_ffffffffffffddd0);
          LogicalType::~LogicalType((LogicalType *)0x1248259);
          ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
          ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)0x1248266);
          LogicalType::~LogicalType((LogicalType *)0x1248273);
          vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1248280)
          ;
          ::std::allocator<duckdb::LogicalType>::~allocator
                    ((allocator<duckdb::LogicalType> *)0x124828d);
          local_1f28 = &local_878;
          do {
            local_1f28 = local_1f28 + -3;
            LogicalType::~LogicalType((LogicalType *)0x12482c2);
          } while (local_1f28 != local_8a8);
          ::std::__cxx11::string::~string(local_848);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_849);
          BaseScalarFunction::SetReturnsError(pBVar24);
          BaseScalarFunction::~BaseScalarFunction(pBVar25);
        }
        else {
          LVar22 = LogicalType::id(local_18);
          if (LVar22 != TIME_TZ) goto LAB_0124b825;
          local_9b9 = 0;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_9e0,"+",&local_9e1);
          local_a48 = (undefined1 ****)local_a40;
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
          local_a48 = (undefined1 ****)local_a28;
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
          local_a10 = (undefined1 ****)local_a40;
          local_a08 = 2;
          ::std::allocator<duckdb::LogicalType>::allocator
                    ((allocator<duckdb::LogicalType> *)0x12485be);
          iVar7._M_len = (size_type)in_stack_ffffffffffffdca0;
          iVar7._M_array = in_stack_ffffffffffffdc98;
          vector<duckdb::LogicalType,_true>::vector
                    ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar7,
                     (allocator_type *)in_stack_ffffffffffffdc88);
          LogicalType::LogicalType
                    ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                     in_stack_ffffffffffffdcaf);
          ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
                    (in_stack_ffffffffffffdca0,
                     (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                     in_stack_ffffffffffffdc98);
          LogicalType::LogicalType
                    ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                     in_stack_ffffffffffffdcaf);
          pBVar25 = (BaseScalarFunction *)0x0;
          pBVar24 = (BaseScalarFunction *)0x0;
          ScalarFunction::ScalarFunction
                    (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                     in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                     in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,
                     in_stack_ffffffffffffddb8,in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,
                     in_stack_ffffffffffffddd0);
          LogicalType::~LogicalType((LogicalType *)0x124869b);
          ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
          ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)0x12486a8);
          LogicalType::~LogicalType((LogicalType *)0x12486b5);
          vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x12486c2)
          ;
          ::std::allocator<duckdb::LogicalType>::~allocator
                    ((allocator<duckdb::LogicalType> *)0x12486cf);
          local_1f78 = &local_a10;
          do {
            local_1f78 = local_1f78 + -3;
            LogicalType::~LogicalType((LogicalType *)0x1248704);
          } while (local_1f78 != local_a40);
          ::std::__cxx11::string::~string(local_9e0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
          BaseScalarFunction::SetReturnsError(pBVar24);
          BaseScalarFunction::~BaseScalarFunction(pBVar25);
        }
      }
    }
    break;
  case TIME:
    LVar22 = LogicalType::id(local_18);
    if (LVar22 == INTERVAL) {
      local_14e1 = 0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1508,"+",&local_1509);
      local_1570 = (undefined1 ****)local_1568;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_1570 = (undefined1 ****)local_1550;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_1538 = (undefined1 ****)local_1568;
      local_1530 = 2;
      ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x124a3ac);
      iVar14._M_len = (size_type)in_stack_ffffffffffffdca0;
      iVar14._M_array = in_stack_ffffffffffffdc98;
      vector<duckdb::LogicalType,_true>::vector
                ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar14,
                 (allocator_type *)in_stack_ffffffffffffdc88);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
      function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
                (in_stack_ffffffffffffdca0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 in_stack_ffffffffffffdc98);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      pBVar25 = (BaseScalarFunction *)0x0;
      pBVar24 = (BaseScalarFunction *)0x0;
      ScalarFunction::ScalarFunction
                (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                 in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                 in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,
                 in_stack_ffffffffffffddb8,in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,
                 in_stack_ffffffffffffddd0);
      LogicalType::~LogicalType((LogicalType *)0x124a489);
      ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *
                )0x124a496);
      LogicalType::~LogicalType((LogicalType *)0x124a4a3);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x124a4b0);
      ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x124a4bd)
      ;
      local_21a8 = &local_1538;
      do {
        local_21a8 = local_21a8 + -3;
        LogicalType::~LogicalType((LogicalType *)0x124a4f2);
      } while (local_21a8 != local_1568);
      ::std::__cxx11::string::~string(local_1508);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1509);
      BaseScalarFunction::SetReturnsError(pBVar24);
      BaseScalarFunction::~BaseScalarFunction(pBVar25);
    }
    else {
      LVar22 = LogicalType::id(local_18);
      if (LVar22 != DATE) goto LAB_0124b825;
      local_1679 = 0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_16a0,"+",&local_16a1);
      local_1708 = (undefined1 ****)local_1700;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_1708 = (undefined1 ****)local_16e8;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_16d0 = (undefined1 ****)local_1700;
      local_16c8 = 2;
      ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x124a7ee);
      iVar15._M_len = (size_type)in_stack_ffffffffffffdca0;
      iVar15._M_array = in_stack_ffffffffffffdc98;
      vector<duckdb::LogicalType,_true>::vector
                ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar15,
                 (allocator_type *)in_stack_ffffffffffffdc88);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
      function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
                (in_stack_ffffffffffffdca0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 in_stack_ffffffffffffdc98);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      pBVar25 = (BaseScalarFunction *)0x0;
      pBVar24 = (BaseScalarFunction *)0x0;
      ScalarFunction::ScalarFunction
                (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                 in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                 in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,
                 in_stack_ffffffffffffddb8,in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,
                 in_stack_ffffffffffffddd0);
      LogicalType::~LogicalType((LogicalType *)0x124a8cb);
      ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *
                )0x124a8d8);
      LogicalType::~LogicalType((LogicalType *)0x124a8e5);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x124a8f2);
      ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x124a8ff)
      ;
      local_21f8 = &local_16d0;
      do {
        local_21f8 = local_21f8 + -3;
        LogicalType::~LogicalType((LogicalType *)0x124a934);
      } while (local_21f8 != local_1700);
      ::std::__cxx11::string::~string(local_16a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_16a1);
      BaseScalarFunction::SetReturnsError(pBVar24);
      BaseScalarFunction::~BaseScalarFunction(pBVar25);
    }
    break;
  case TIMESTAMP:
    LVar22 = LogicalType::id(local_18);
    if (LVar22 == INTERVAL) {
      local_1b41 = 0;
      paVar26 = &local_1b69;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1b68,"+",paVar26);
      local_1bd0 = (undefined1 ****)local_1bc8;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_1bd0 = (undefined1 ****)local_1bb0;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_1b98 = (undefined1 ****)local_1bc8;
      local_1b90 = 2;
      ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x124b4c2);
      iVar18._M_len = (size_type)in_stack_ffffffffffffdca0;
      iVar18._M_array = in_stack_ffffffffffffdc98;
      vector<duckdb::LogicalType,_true>::vector
                ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar18,
                 (allocator_type *)in_stack_ffffffffffffdc88);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
      function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
                (in_stack_ffffffffffffdca0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 in_stack_ffffffffffffdc98);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      pBVar25 = (BaseScalarFunction *)0x0;
      pBVar24 = (BaseScalarFunction *)0x0;
      ScalarFunction::ScalarFunction
                (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                 in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                 in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,
                 in_stack_ffffffffffffddb8,in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,
                 in_stack_ffffffffffffddd0);
      LogicalType::~LogicalType((LogicalType *)0x124b59f);
      ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *
                )0x124b5ac);
      LogicalType::~LogicalType((LogicalType *)0x124b5b9);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x124b5c6);
      ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x124b5d3)
      ;
      ppppuVar27 = &local_1b98;
      do {
        ppppuVar27 = ppppuVar27 + -3;
        LogicalType::~LogicalType((LogicalType *)0x124b608);
      } while (ppppuVar27 != local_1bc8);
      ::std::__cxx11::string::~string(local_1b68);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1b69);
      BaseScalarFunction::SetReturnsError(pBVar24);
      BaseScalarFunction::~BaseScalarFunction(pBVar25);
      return in_RDI;
    }
LAB_0124b825:
    uVar23 = __cxa_allocate_exception(0x10);
    paVar26 = &local_1cf9;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1cf8,"AddFunction for types %s, %s",paVar26);
    LogicalType::id(local_10);
    EnumUtil::ToString<duckdb::LogicalTypeId>(LVar21);
    LogicalType::id(local_18);
    EnumUtil::ToString<duckdb::LogicalTypeId>(LVar21);
    NotImplementedException::NotImplementedException<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28,in_stack_ffffffffffffdd20,
               in_stack_ffffffffffffdd18);
    __cxa_throw(uVar23,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  case INTERVAL:
    LVar22 = LogicalType::id(local_18);
    if (LVar22 == INTERVAL) {
      local_ce9 = 0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d10,"+",&local_d11);
      local_d78 = (undefined1 ****)local_d70;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_d78 = (undefined1 ****)local_d58;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_d40 = (undefined1 ****)local_d70;
      local_d38 = 2;
      ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x1248e55);
      iVar9._M_len = (size_type)in_stack_ffffffffffffdca0;
      iVar9._M_array = in_stack_ffffffffffffdc98;
      vector<duckdb::LogicalType,_true>::vector
                ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar9,
                 (allocator_type *)in_stack_ffffffffffffdc88);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
      function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
                (in_stack_ffffffffffffdca0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 in_stack_ffffffffffffdc98);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      pBVar25 = (BaseScalarFunction *)0x0;
      pBVar24 = (BaseScalarFunction *)0x0;
      ScalarFunction::ScalarFunction
                (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                 in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                 in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,
                 in_stack_ffffffffffffddb8,in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,
                 in_stack_ffffffffffffddd0);
      LogicalType::~LogicalType((LogicalType *)0x1248f32);
      ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *
                )0x1248f3f);
      LogicalType::~LogicalType((LogicalType *)0x1248f4c);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1248f59);
      ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x1248f66)
      ;
      local_2018 = &local_d40;
      do {
        local_2018 = local_2018 + -3;
        LogicalType::~LogicalType((LogicalType *)0x1248f9b);
      } while (local_2018 != local_d70);
      ::std::__cxx11::string::~string(local_d10);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_d11);
      BaseScalarFunction::SetReturnsError(pBVar24);
      BaseScalarFunction::~BaseScalarFunction(pBVar25);
    }
    else {
      LVar22 = LogicalType::id(local_18);
      if (LVar22 == DATE) {
        local_e81 = 0;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_ea8,"+",&local_ea9);
        local_f10 = (undefined1 ****)local_f08;
        LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88)
        ;
        local_f10 = (undefined1 ****)local_ef0;
        LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88)
        ;
        local_ed8 = (undefined1 ****)local_f08;
        local_ed0 = 2;
        ::std::allocator<duckdb::LogicalType>::allocator
                  ((allocator<duckdb::LogicalType> *)0x1249297);
        iVar10._M_len = (size_type)in_stack_ffffffffffffdca0;
        iVar10._M_array = in_stack_ffffffffffffdc98;
        vector<duckdb::LogicalType,_true>::vector
                  ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar10,
                   (allocator_type *)in_stack_ffffffffffffdc88);
        LogicalType::LogicalType
                  ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                   in_stack_ffffffffffffdcaf);
        ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
        function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
                  (in_stack_ffffffffffffdca0,
                   (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                   in_stack_ffffffffffffdc98);
        LogicalType::LogicalType
                  ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                   in_stack_ffffffffffffdcaf);
        pBVar25 = (BaseScalarFunction *)0x0;
        pBVar24 = (BaseScalarFunction *)0x0;
        ScalarFunction::ScalarFunction
                  (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                   in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                   in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,
                   in_stack_ffffffffffffddb8,in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,
                   in_stack_ffffffffffffddd0);
        LogicalType::~LogicalType((LogicalType *)0x1249374);
        ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                   *)0x1249381);
        LogicalType::~LogicalType((LogicalType *)0x124938e);
        vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x124939b);
        ::std::allocator<duckdb::LogicalType>::~allocator
                  ((allocator<duckdb::LogicalType> *)0x12493a8);
        local_2068 = &local_ed8;
        do {
          local_2068 = local_2068 + -3;
          LogicalType::~LogicalType((LogicalType *)0x12493dd);
        } while (local_2068 != local_f08);
        ::std::__cxx11::string::~string(local_ea8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_ea9);
        BaseScalarFunction::SetReturnsError(pBVar24);
        BaseScalarFunction::~BaseScalarFunction(pBVar25);
      }
      else {
        LVar22 = LogicalType::id(local_18);
        if (LVar22 == TIME) {
          local_1019 = 0;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_1040,"+",&local_1041);
          local_10a8 = (undefined1 ****)local_10a0;
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
          local_10a8 = (undefined1 ****)local_1088;
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
          local_1070 = (undefined1 ****)local_10a0;
          local_1068 = 2;
          ::std::allocator<duckdb::LogicalType>::allocator
                    ((allocator<duckdb::LogicalType> *)0x12496d9);
          iVar11._M_len = (size_type)in_stack_ffffffffffffdca0;
          iVar11._M_array = in_stack_ffffffffffffdc98;
          vector<duckdb::LogicalType,_true>::vector
                    ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar11,
                     (allocator_type *)in_stack_ffffffffffffdc88);
          LogicalType::LogicalType
                    ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                     in_stack_ffffffffffffdcaf);
          ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
                    (in_stack_ffffffffffffdca0,
                     (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                     in_stack_ffffffffffffdc98);
          LogicalType::LogicalType
                    ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                     in_stack_ffffffffffffdcaf);
          pBVar25 = (BaseScalarFunction *)0x0;
          pBVar24 = (BaseScalarFunction *)0x0;
          ScalarFunction::ScalarFunction
                    (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                     in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                     in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,
                     in_stack_ffffffffffffddb8,in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,
                     in_stack_ffffffffffffddd0);
          LogicalType::~LogicalType((LogicalType *)0x12497b6);
          ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
          ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)0x12497c3);
          LogicalType::~LogicalType((LogicalType *)0x12497d0);
          vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x12497dd)
          ;
          ::std::allocator<duckdb::LogicalType>::~allocator
                    ((allocator<duckdb::LogicalType> *)0x12497ea);
          local_20b8 = &local_1070;
          do {
            local_20b8 = local_20b8 + -3;
            LogicalType::~LogicalType((LogicalType *)0x124981f);
          } while (local_20b8 != local_10a0);
          ::std::__cxx11::string::~string(local_1040);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1041);
          BaseScalarFunction::SetReturnsError(pBVar24);
          BaseScalarFunction::~BaseScalarFunction(pBVar25);
        }
        else {
          LVar22 = LogicalType::id(local_18);
          if (LVar22 == TIME_TZ) {
            local_11b1 = 0;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_11d8,"+",&local_11d9);
            local_1240 = (undefined1 ****)local_1238;
            LogicalType::LogicalType
                      ((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
            local_1240 = (undefined1 ****)local_1220;
            LogicalType::LogicalType
                      ((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
            local_1208 = (undefined1 ****)local_1238;
            local_1200 = 2;
            ::std::allocator<duckdb::LogicalType>::allocator
                      ((allocator<duckdb::LogicalType> *)0x1249b1b);
            iVar12._M_len = (size_type)in_stack_ffffffffffffdca0;
            iVar12._M_array = in_stack_ffffffffffffdc98;
            vector<duckdb::LogicalType,_true>::vector
                      ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar12,
                       (allocator_type *)in_stack_ffffffffffffdc88);
            LogicalType::LogicalType
                      ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                       in_stack_ffffffffffffdcaf);
            ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
            function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
                      (in_stack_ffffffffffffdca0,
                       (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                       in_stack_ffffffffffffdc98);
            LogicalType::LogicalType
                      ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                       in_stack_ffffffffffffdcaf);
            pBVar25 = (BaseScalarFunction *)0x0;
            pBVar24 = (BaseScalarFunction *)0x0;
            ScalarFunction::ScalarFunction
                      (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80
                       ,in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,
                       in_stack_ffffffffffffdd68,in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8
                       ,in_stack_ffffffffffffddb0,in_stack_ffffffffffffddb8,
                       in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,in_stack_ffffffffffffddd0
                      );
            LogicalType::~LogicalType((LogicalType *)0x1249bf8);
            ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
            ::~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                         *)0x1249c05);
            LogicalType::~LogicalType((LogicalType *)0x1249c12);
            vector<duckdb::LogicalType,_true>::~vector
                      ((vector<duckdb::LogicalType,_true> *)0x1249c1f);
            ::std::allocator<duckdb::LogicalType>::~allocator
                      ((allocator<duckdb::LogicalType> *)0x1249c2c);
            local_2108 = &local_1208;
            do {
              local_2108 = local_2108 + -3;
              LogicalType::~LogicalType((LogicalType *)0x1249c61);
            } while (local_2108 != local_1238);
            ::std::__cxx11::string::~string(local_11d8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_11d9);
            BaseScalarFunction::SetReturnsError(pBVar24);
            BaseScalarFunction::~BaseScalarFunction(pBVar25);
          }
          else {
            LVar22 = LogicalType::id(local_18);
            if (LVar22 != TIMESTAMP) goto LAB_0124b825;
            local_1349 = 0;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_1370,"+",&local_1371);
            local_13d8 = (undefined1 ****)local_13d0;
            LogicalType::LogicalType
                      ((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
            local_13d8 = (undefined1 ****)local_13b8;
            LogicalType::LogicalType
                      ((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
            local_13a0 = (undefined1 ****)local_13d0;
            local_1398 = 2;
            ::std::allocator<duckdb::LogicalType>::allocator
                      ((allocator<duckdb::LogicalType> *)0x1249f5d);
            iVar13._M_len = (size_type)in_stack_ffffffffffffdca0;
            iVar13._M_array = in_stack_ffffffffffffdc98;
            vector<duckdb::LogicalType,_true>::vector
                      ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar13,
                       (allocator_type *)in_stack_ffffffffffffdc88);
            LogicalType::LogicalType
                      ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                       in_stack_ffffffffffffdcaf);
            ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
            function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
                      (in_stack_ffffffffffffdca0,
                       (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                       in_stack_ffffffffffffdc98);
            LogicalType::LogicalType
                      ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                       in_stack_ffffffffffffdcaf);
            pBVar25 = (BaseScalarFunction *)0x0;
            pBVar24 = (BaseScalarFunction *)0x0;
            ScalarFunction::ScalarFunction
                      (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80
                       ,in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,
                       in_stack_ffffffffffffdd68,in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8
                       ,in_stack_ffffffffffffddb0,in_stack_ffffffffffffddb8,
                       in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,in_stack_ffffffffffffddd0
                      );
            LogicalType::~LogicalType((LogicalType *)0x124a03a);
            ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
            ::~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                         *)0x124a047);
            LogicalType::~LogicalType((LogicalType *)0x124a054);
            vector<duckdb::LogicalType,_true>::~vector
                      ((vector<duckdb::LogicalType,_true> *)0x124a061);
            ::std::allocator<duckdb::LogicalType>::~allocator
                      ((allocator<duckdb::LogicalType> *)0x124a06e);
            local_2158 = &local_13a0;
            do {
              local_2158 = local_2158 + -3;
              LogicalType::~LogicalType((LogicalType *)0x124a0a3);
            } while (local_2158 != local_13d0);
            ::std::__cxx11::string::~string(local_1370);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1371);
            BaseScalarFunction::SetReturnsError(pBVar24);
            BaseScalarFunction::~BaseScalarFunction(pBVar25);
          }
        }
      }
    }
    break;
  case TIME_TZ:
    LVar22 = LogicalType::id(local_18);
    if (LVar22 == DATE) {
      local_1811 = 0;
      paVar26 = &local_1839;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1838,"+",paVar26);
      null_handling = (FunctionNullHandling)paVar26;
      local_18a0 = (undefined1 ****)local_1898;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_18a0 = (undefined1 ****)local_1880;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_1868 = (undefined1 ****)local_1898;
      local_1860 = 2;
      side_effects = (FunctionStability)&local_18a1;
      ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x124ac37);
      iVar16._M_len = (size_type)in_stack_ffffffffffffdca0;
      iVar16._M_array = in_stack_ffffffffffffdc98;
      vector<duckdb::LogicalType,_true>::vector
                ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar16,
                 (allocator_type *)in_stack_ffffffffffffdc88);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
      function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
                (in_stack_ffffffffffffdca0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 in_stack_ffffffffffffdc98);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      pBVar25 = (BaseScalarFunction *)0x0;
      pBVar24 = (BaseScalarFunction *)0x0;
      ScalarFunction::ScalarFunction
                (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                 in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                 in_stack_ffffffffffffdda0,in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,
                 in_stack_ffffffffffffddb8,side_effects,null_handling,in_stack_ffffffffffffddd0);
      LogicalType::~LogicalType((LogicalType *)0x124ad14);
      ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *
                )0x124ad21);
      LogicalType::~LogicalType((LogicalType *)0x124ad2e);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x124ad3b);
      ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x124ad48)
      ;
      ppppuVar27 = local_1898;
      ppppuVar29 = &local_1868;
      do {
        ppppuVar29 = ppppuVar29 + -3;
        LogicalType::~LogicalType((LogicalType *)0x124ad7d);
      } while (ppppuVar29 != ppppuVar27);
      ::std::__cxx11::string::~string(local_1838);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1839);
      BaseScalarFunction::SetReturnsError(pBVar24);
      BaseScalarFunction::~BaseScalarFunction(pBVar25);
    }
    else {
      LVar22 = LogicalType::id(local_18);
      if (LVar22 != INTERVAL) goto LAB_0124b825;
      local_19a9 = 0;
      return_type = &local_19d1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_19d1.physical_type_,"+",(allocator *)return_type);
      local_1a39._1_8_ = local_1a39 + 9;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_1a39._1_8_ = local_1a18;
      LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88);
      local_1a00 = local_1a39 + 9;
      local_19f8 = 2;
      function_00 = (scalar_function_t *)local_1a39;
      ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x124b079);
      iVar17._M_len = (size_type)in_stack_ffffffffffffdca0;
      iVar17._M_array = in_stack_ffffffffffffdc98;
      vector<duckdb::LogicalType,_true>::vector
                ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffdc90,iVar17,
                 (allocator_type *)in_stack_ffffffffffffdc88);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
      function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
                (in_stack_ffffffffffffdca0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 in_stack_ffffffffffffdc98);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 in_stack_ffffffffffffdcaf);
      pBVar25 = (BaseScalarFunction *)0x0;
      pBVar24 = (BaseScalarFunction *)0x0;
      ScalarFunction::ScalarFunction
                (in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                 return_type,function_00,in_stack_ffffffffffffdd68,in_stack_ffffffffffffdda0,
                 in_stack_ffffffffffffdda8,in_stack_ffffffffffffddb0,in_stack_ffffffffffffddb8,
                 in_stack_ffffffffffffddc0,in_stack_ffffffffffffddc8,in_stack_ffffffffffffddd0);
      LogicalType::~LogicalType((LogicalType *)0x124b156);
      ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *
                )0x124b163);
      LogicalType::~LogicalType((LogicalType *)0x124b170);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x124b17d);
      ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x124b18a)
      ;
      ppuVar28 = &local_1a00;
      do {
        ppuVar28 = ppuVar28 + -3;
        LogicalType::~LogicalType((LogicalType *)0x124b1bf);
      } while (ppuVar28 != (undefined1 **)(local_1a39 + 9));
      ::std::__cxx11::string::~string((string *)&local_19d1.physical_type_);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_19d1);
      BaseScalarFunction::SetReturnsError(pBVar24);
      BaseScalarFunction::~BaseScalarFunction(pBVar25);
    }
  }
  return in_RDI;
}

Assistant:

ScalarFunction AddFunction::GetFunction(const LogicalType &left_type, const LogicalType &right_type) {
	if (left_type.IsNumeric() && left_type.id() == right_type.id()) {
		if (left_type.id() == LogicalTypeId::DECIMAL) {
			auto function = ScalarFunction("+", {left_type, right_type}, left_type, nullptr,
			                               BindDecimalAddSubtract<AddOperator, DecimalAddOverflowCheck>);
			BaseScalarFunction::SetReturnsError(function);
			function.serialize = SerializeDecimalArithmetic;
			function.deserialize = DeserializeDecimalArithmetic<AddOperator, DecimalAddOverflowCheck>;
			return function;
		} else if (left_type.IsIntegral()) {
			ScalarFunction function("+", {left_type, right_type}, left_type,
			                        GetScalarIntegerFunction<AddOperatorOverflowCheck>(left_type.InternalType()),
			                        nullptr, nullptr,
			                        PropagateNumericStats<TryAddOperator, AddPropagateStatistics, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else {
			ScalarFunction function("+", {left_type, right_type}, left_type,
			                        GetScalarBinaryFunction<AddOperator>(left_type.InternalType()));
			BaseScalarFunction::SetReturnsError(function);
			return function;
		}
	}

	switch (left_type.id()) {
	case LogicalTypeId::DATE:
		if (right_type.id() == LogicalTypeId::INTEGER) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::DATE,
			                        ScalarFunction::BinaryFunction<date_t, int32_t, date_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::INTERVAL) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<date_t, interval_t, timestamp_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::TIME) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<date_t, dtime_t, timestamp_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::TIME_TZ) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP_TZ,
			                        ScalarFunction::BinaryFunction<date_t, dtime_tz_t, timestamp_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	case LogicalTypeId::INTEGER:
		if (right_type.id() == LogicalTypeId::DATE) {
			ScalarFunction function("+", {left_type, right_type}, right_type,
			                        ScalarFunction::BinaryFunction<int32_t, date_t, date_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	case LogicalTypeId::INTERVAL:
		if (right_type.id() == LogicalTypeId::INTERVAL) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::INTERVAL,
			                        ScalarFunction::BinaryFunction<interval_t, interval_t, interval_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::DATE) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<interval_t, date_t, timestamp_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::TIME) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIME,
			                        ScalarFunction::BinaryFunction<interval_t, dtime_t, dtime_t, AddTimeOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::TIME_TZ) {
			ScalarFunction function(
			    "+", {left_type, right_type}, LogicalType::TIME_TZ,
			    ScalarFunction::BinaryFunction<interval_t, dtime_tz_t, dtime_tz_t, AddTimeOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::TIMESTAMP) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<interval_t, timestamp_t, timestamp_t, AddOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	case LogicalTypeId::TIME:
		if (right_type.id() == LogicalTypeId::INTERVAL) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIME,
			                        ScalarFunction::BinaryFunction<dtime_t, interval_t, dtime_t, AddTimeOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::DATE) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<dtime_t, date_t, timestamp_t, AddOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	case LogicalTypeId::TIME_TZ:
		if (right_type.id() == LogicalTypeId::DATE) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP_TZ,
			                        ScalarFunction::BinaryFunction<dtime_tz_t, date_t, timestamp_t, AddOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::INTERVAL) {
			ScalarFunction function(
			    "+", {left_type, right_type}, LogicalType::TIME_TZ,
			    ScalarFunction::BinaryFunction<dtime_tz_t, interval_t, dtime_tz_t, AddTimeOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	case LogicalTypeId::TIMESTAMP:
		if (right_type.id() == LogicalTypeId::INTERVAL) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<timestamp_t, interval_t, timestamp_t, AddOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	default:
		break;
	}
	// LCOV_EXCL_START
	throw NotImplementedException("AddFunction for types %s, %s", EnumUtil::ToString(left_type.id()),
	                              EnumUtil::ToString(right_type.id()));
	// LCOV_EXCL_STOP
}